

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utilities.cpp
# Opt level: O2

XmlNodePtr __thiscall libcellml::mathmlChildNode(libcellml *this,XmlNodePtr *node,size_t index)

{
  bool bVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  size_t sVar3;
  XmlNodePtr XVar4;
  __shared_ptr<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2> _Stack_38;
  
  XmlNode::firstChild((XmlNode *)this);
  bVar1 = XmlNode::isMathmlElement(*(XmlNode **)this,(char *)0x0);
  sVar3 = (ulong)bVar1 - 1;
  _Var2._M_pi = extraout_RDX;
  while ((*(long *)this != 0 && (sVar3 != index))) {
    XmlNode::next((XmlNode *)&_Stack_38);
    std::__shared_ptr<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2>::operator=
              ((__shared_ptr<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2> *)this,&_Stack_38);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_38._M_refcount);
    _Var2._M_pi = extraout_RDX_00;
    if (*(XmlNode **)this != (XmlNode *)0x0) {
      bVar1 = XmlNode::isMathmlElement(*(XmlNode **)this,(char *)0x0);
      sVar3 = sVar3 + bVar1;
      _Var2._M_pi = extraout_RDX_01;
    }
  }
  XVar4.super___shared_ptr<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var2._M_pi;
  XVar4.super___shared_ptr<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (XmlNodePtr)XVar4.super___shared_ptr<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

XmlNodePtr mathmlChildNode(const XmlNodePtr &node, size_t index)
{
    auto res = node->firstChild();
    auto childNodeIndex = res->isMathmlElement() ? 0 : MAX_SIZE_T;

    while ((res != nullptr) && (childNodeIndex != index)) {
        res = res->next();

        if ((res != nullptr) && res->isMathmlElement()) {
            ++childNodeIndex;
        }
    }

    return res;
}